

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testGroupStarting(StreamingReporterBase *this,GroupInfo *_groupInfo)

{
  Option<Catch::GroupInfo> *in_stack_ffffffffffffffa8;
  Option<Catch::GroupInfo> *in_stack_ffffffffffffffb0;
  
  Option<Catch::GroupInfo>::Option(in_stack_ffffffffffffffb0,(GroupInfo *)in_stack_ffffffffffffffa8)
  ;
  Option<Catch::GroupInfo>::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Option<Catch::GroupInfo>::~Option((Option<Catch::GroupInfo> *)0x180879);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& _groupInfo ) {
            unusedGroupInfo = _groupInfo;
        }